

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UInt32Math.h
# Opt level: O0

uint32 UInt32Math::MulAdd<3u,3u,Math::RecordOverflowPolicy>
                 (uint32 left,RecordOverflowPolicy *overflowFn)

{
  RecordOverflowPolicy *overflowFn_local;
  uint32 left_local;
  
  if (0x55555554 < left) {
    Math::RecordOverflowPolicy::operator()(overflowFn);
  }
  return left * 3 + 3;
}

Assistant:

static uint32 MulAdd(uint32 left, __inout Func& overflowFn)
    {
        //
        // The result will overflow if (left*mul)+add > UINT_MAX
        // Rearranging, this becomes: left > (UINT_MAX - add) / mul
        //
        // If add and mul are compile-time constants then LTCG will collapse
        // this to a simple constant comparison.
        //
        if( left > ((UINT_MAX - add) / mul) )
        {
            overflowFn();
        }

        // When add and mul are small constants, the compiler is
        // typically able to use the LEA instruction here.
        return (left * mul) + add;
    }